

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall
hgdb::json::Module::Module
          (Module *this,string *name,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *remove_func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase.scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase.scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase.parent = (ScopeBase *)0x0;
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase.scopes_.
  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase.index_ = 0;
  (this->super_Scope<hgdb::json::Module>).filename._M_dataplus._M_p =
       (pointer)&(this->super_Scope<hgdb::json::Module>).filename.field_2;
  (this->super_Scope<hgdb::json::Module>).filename._M_string_length = 0;
  (this->super_Scope<hgdb::json::Module>).filename.field_2._M_local_buf[0] = '\0';
  (this->super_Scope<hgdb::json::Module>).line_num.super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->super_Scope<hgdb::json::Module>).column_num = 0;
  (this->super_Scope<hgdb::json::Module>).condition._M_dataplus._M_p =
       (pointer)&(this->super_Scope<hgdb::json::Module>).condition.field_2;
  (this->super_Scope<hgdb::json::Module>).condition._M_string_length = 0;
  (this->super_Scope<hgdb::json::Module>).condition.field_2._M_local_buf[0] = '\0';
  (this->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase =
       (_func_int **)&PTR_serialize_002db1e0;
  paVar2 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->remove_inst_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->remove_inst_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->remove_inst_).super__Function_base._M_functor + 8) = 0;
  (this->instances_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instances_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->variables_).
  super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->instances_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables_).
  super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables_).
  super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remove_inst_)._M_invoker = remove_func->_M_invoker;
  if ((remove_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(remove_func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->remove_inst_).super__Function_base._M_functor =
         *(undefined8 *)&(remove_func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->remove_inst_).super__Function_base._M_functor + 8) = uVar4;
    (this->remove_inst_).super__Function_base._M_manager =
         (remove_func->super__Function_base)._M_manager;
    (remove_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    remove_func->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

Module(std::string name, std::function<void(const std::string &)> remove_func)
        : name_(std::move(name)), remove_inst_(std::move(remove_func)) {}